

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O3

void __thiscall QFontDialogPrivate::updateStyles(QFontDialogPrivate *this)

{
  QWidget *this_00;
  QLineEdit *this_01;
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *pQVar5;
  QStyle *pQVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  CaseSensitivity CVar10;
  long lVar11;
  QAbstractItemView *pQVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QStringView QVar19;
  QLatin1String QVar20;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  QAbstractItemModel *local_98;
  QArrayDataPointer<QString> local_88;
  QString local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar12 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_50,pQVar12);
  lVar11 = (long)local_50.r;
  if (lVar11 < 0) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
  }
  else {
    QAbstractItemView::model(pQVar12);
    QStringListModel::stringList();
    local_68.d.d = *(Data **)(local_50.i + lVar11 * 0x18);
    local_68.d.ptr = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
    local_68.d.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
  }
  QFontDatabase::styles((QString *)&local_88);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar5 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
  QStringListModel::setStringList((QList_conflict *)pQVar5);
  if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
    QLineEdit::clear(this->styleEdit);
    this->smoothScalable = false;
    goto LAB_004fbeba;
  }
  pQVar5 = (QAbstractItemModel *)(this->style).d.size;
  if (pQVar5 != (QAbstractItemModel *)0x0) {
    local_a8 = &((this->style).d.d)->super_QArrayData;
    pcStack_a0 = (this->style).d.ptr;
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_a8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar2 = false;
    local_98 = pQVar5;
    do {
      pQVar5 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
      local_50._0_8_ = (QArrayData *)0xffffffffffffffff;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,(QString *)&local_50);
      if (0 < iVar3) {
        iVar3 = 0;
        do {
          QFontListView::text((QString *)&local_50,this->styleList,iVar3);
          if (local_98 == local_50.m.ptr) {
            QVar13.m_data = pcStack_a0;
            QVar13.m_size = (qsizetype)local_98;
            QVar19.m_data = (storage_type_conflict *)local_50.i;
            QVar19.m_size = (qsizetype)local_98;
            cVar1 = QtPrivate::equalStrings(QVar13,QVar19);
          }
          else {
            cVar1 = '\0';
          }
          if ((QArrayData *)local_50._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_50._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_50._0_8_,2,0x10);
            }
          }
          if (cVar1 != '\0') {
            pQVar12 = (QAbstractItemView *)this->styleList;
            pQVar5 = QAbstractItemView::model(pQVar12);
            lVar11 = *(long *)pQVar5;
            goto LAB_004fbbda;
          }
          iVar3 = iVar3 + 1;
          pQVar5 = QAbstractItemView::model((QAbstractItemView *)this->styleList);
          local_50._0_8_ = (QArrayData *)0xffffffffffffffff;
          local_50.i = 0;
          local_50.m.ptr = (QAbstractItemModel *)0x0;
          iVar4 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,(QString *)&local_50);
        } while (iVar3 < iVar4);
      }
      if (bVar2) goto LAB_004fbef1;
      QVar14.m_data = (char *)0x6;
      QVar14.m_size = (qsizetype)&local_a8;
      lVar11 = QString::indexOf(QVar14,0x6e66fe,CaseInsensitive);
      if (lVar11 == -1) {
        QVar15.m_data = (char *)0x7;
        QVar15.m_size = (qsizetype)&local_a8;
        lVar11 = QString::indexOf(QVar15,0x6e6705,CaseInsensitive);
        pcVar9 = (char *)0x7;
        if (lVar11 == -1) {
          QVar16.m_data = (char *)0x7;
          QVar16.m_size = (qsizetype)&local_a8;
          lVar11 = QString::indexOf(QVar16,0x6e670d,CaseInsensitive);
          if (lVar11 == -1) {
            QVar17.m_data = (char *)0x6;
            QVar17.m_size = (qsizetype)&local_a8;
            lVar11 = QString::indexOf(QVar17,0x6e6715,CaseInsensitive);
            if (lVar11 == -1) goto LAB_004fbef1;
            pcVar9 = (char *)0x6;
            pcVar7 = (char *)0x7;
            pcVar8 = "Normal";
            CVar10 = 0x6e670d;
          }
          else {
            pcVar9 = (char *)0x7;
            pcVar7 = (char *)0x6;
            pcVar8 = "Regular";
            CVar10 = 0x6e6715;
          }
        }
        else {
          pcVar7 = (char *)0x6;
          pcVar8 = "Oblique";
          CVar10 = 0x6e66fe;
        }
      }
      else {
        pcVar9 = (char *)0x6;
        pcVar7 = (char *)0x7;
        pcVar8 = "Italic";
        CVar10 = 0x6e6705;
      }
      QVar18.m_data = pcVar9;
      QVar18.m_size = (qsizetype)&local_a8;
      QVar20.m_data = pcVar7;
      QVar20.m_size = (qsizetype)pcVar8;
      QString::replace(QVar18,QVar20,CVar10);
      bVar2 = true;
    } while( true );
  }
  pQVar12 = (QAbstractItemView *)this->styleList;
  pQVar5 = QAbstractItemView::model(pQVar12);
  local_68.d.d = (Data *)0xffffffffffffffff;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  (**(code **)(*(long *)pQVar5 + 0x60))(&local_50,pQVar5,0,0);
  QAbstractItemView::setCurrentIndex(pQVar12,&local_50);
  goto LAB_004fbc54;
LAB_004fbef1:
  pQVar12 = (QAbstractItemView *)this->styleList;
  pQVar5 = QAbstractItemView::model(pQVar12);
  lVar11 = *(long *)pQVar5;
  iVar3 = 0;
LAB_004fbbda:
  local_68.d.size = 0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.d = (Data *)0xffffffffffffffff;
  (**(code **)(lVar11 + 0x60))(&local_50,pQVar5,iVar3,0);
  QAbstractItemView::setCurrentIndex(pQVar12,&local_50);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
LAB_004fbc54:
  this_01 = this->styleEdit;
  pQVar12 = (QAbstractItemView *)this->styleList;
  QAbstractItemView::currentIndex(&local_50,pQVar12);
  lVar11 = (long)local_50.r;
  if (lVar11 < 0) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
  }
  else {
    QAbstractItemView::model(pQVar12);
    QStringListModel::stringList();
    local_68.d.d = *(Data **)(local_50.i + lVar11 * 0x18);
    local_68.d.ptr = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
    local_68.d.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
  }
  QLineEdit::setText(this_01,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = QWidget::style(this_00);
  iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0xd,0,this_00,0);
  if (iVar3 != 0) {
    bVar2 = QWidget::hasFocus((QWidget *)this->styleList);
    if (bVar2) {
      QLineEdit::selectAll(this->styleEdit);
    }
  }
  pQVar12 = (QAbstractItemView *)this->familyList;
  QAbstractItemView::currentIndex(&local_50,pQVar12);
  lVar11 = (long)local_50.r;
  if (lVar11 < 0) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
  }
  else {
    QAbstractItemView::model(pQVar12);
    QStringListModel::stringList();
    local_68.d.d = *(Data **)(local_50.i + lVar11 * 0x18);
    local_68.d.ptr = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
    local_68.d.size = *(qsizetype *)(local_50.i + lVar11 * 0x18 + 0x10);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
  }
  pQVar12 = (QAbstractItemView *)this->styleList;
  QAbstractItemView::currentIndex(&local_50,pQVar12);
  lVar11 = (long)local_50.r;
  if (lVar11 < 0) {
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = (char16_t *)0x0;
    local_98 = (QAbstractItemModel *)0x0;
  }
  else {
    QAbstractItemView::model(pQVar12);
    QStringListModel::stringList();
    local_a8 = *(QArrayData **)(local_50.i + lVar11 * 0x18);
    pcStack_a0 = *(char16_t **)(local_50.i + lVar11 * 0x18 + 8);
    local_98 = *(QAbstractItemModel **)(local_50.i + lVar11 * 0x18 + 0x10);
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_50);
  }
  bVar2 = (bool)QFontDatabase::isSmoothlyScalable((QString *)&local_68,(QString *)&local_a8);
  this->smoothScalable = bVar2;
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004fbeba:
  updateSizes(this);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFontDialogPrivate::updateStyles()
{
    Q_Q(QFontDialog);
    QStringList styles = QFontDatabase::styles(familyList->currentText());
    styleList->model()->setStringList(styles);

    if (styles.isEmpty()) {
        styleEdit->clear();
        smoothScalable = false;
    } else {
        if (!style.isEmpty()) {
            bool found = false;
            bool first = true;
            QString cstyle = style;

        redo:
            for (int i = 0; i < static_cast<int>(styleList->count()); i++) {
                if (cstyle == styleList->text(i)) {
                     styleList->setCurrentItem(i);
                     found = true;
                     break;
                 }
            }
            if (!found && first) {
                if (cstyle.contains("Italic"_L1)) {
                    cstyle.replace("Italic"_L1, "Oblique"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Oblique"_L1)) {
                    cstyle.replace("Oblique"_L1, "Italic"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Regular"_L1)) {
                    cstyle.replace("Regular"_L1, "Normal"_L1);
                    first = false;
                    goto redo;
                } else if (cstyle.contains("Normal"_L1)) {
                    cstyle.replace("Normal"_L1, "Regular"_L1);
                    first = false;
                    goto redo;
                }
            }
            if (!found)
                styleList->setCurrentItem(0);
        } else {
            styleList->setCurrentItem(0);
        }

        styleEdit->setText(styleList->currentText());
        if (q->style()->styleHint(QStyle::SH_FontDialog_SelectAssociatedText, nullptr, q)
                && styleList->hasFocus())
            styleEdit->selectAll();

        smoothScalable = QFontDatabase::isSmoothlyScalable(familyList->currentText(), styleList->currentText());
    }

    updateSizes();
}